

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_MultiFabUtil.cpp
# Opt level: O1

HostVector<Real> *
amrex::sumToLine(HostVector<Real> *__return_storage_ptr__,MultiFab *mf,int icomp,int ncomp,
                Box *domain,int direction,bool local)

{
  pointer pdVar1;
  HostVector<Real> *pHVar2;
  double *pdVar3;
  ulong uVar4;
  int iVar5;
  HostVector<Real> *__range2;
  uint uVar6;
  size_type a_capacity;
  long lVar7;
  pointer pPVar8;
  int iVar9;
  ulong uVar10;
  bool bVar11;
  double dVar12;
  Vector<double_*,_std::allocator<double_*>_> pp;
  Vector<amrex::PODVector<double,_std::allocator<double>_>,_std::allocator<amrex::PODVector<double,_std::allocator<double>_>_>_>
  other_hv;
  MFIter mfi;
  ulong local_178;
  long local_170;
  long local_168;
  double *local_158;
  Box local_14c;
  HostVector<Real> *local_130;
  long local_128;
  ulong local_120;
  uint local_118;
  int local_114;
  FabArray<amrex::FArrayBox> *local_110;
  Array4<const_double> local_108;
  vector<double_*,_std::allocator<double_*>_> local_c8;
  ulong local_b0;
  vector<amrex::PODVector<double,_std::allocator<double>_>,_std::allocator<amrex::PODVector<double,_std::allocator<double>_>_>_>
  local_a8;
  MFIter local_90;
  
  uVar6 = (((domain->bigend).vect[direction] - (domain->smallend).vect[direction]) + 1) * ncomp;
  uVar10 = (ulong)(int)uVar6;
  __return_storage_ptr__->m_data = (pointer)0x0;
  __return_storage_ptr__->m_size = 0;
  __return_storage_ptr__->m_capacity = 0;
  a_capacity = 8;
  if (8 < uVar6) {
    do {
      a_capacity = a_capacity * 3 + 1 >> 1;
    } while (a_capacity < uVar10);
  }
  local_110 = &mf->super_FabArray<amrex::FArrayBox>;
  PODVector<double,_std::allocator<double>_>::AllocateBuffer(__return_storage_ptr__,a_capacity);
  __return_storage_ptr__->m_size = uVar10;
  if (uVar6 != 0) {
    memset(__return_storage_ptr__->m_data,0,uVar10 * 8);
  }
  local_130 = __return_storage_ptr__;
  std::
  vector<amrex::PODVector<double,_std::allocator<double>_>,_std::allocator<amrex::PODVector<double,_std::allocator<double>_>_>_>
  ::vector(&local_a8,0,(allocator_type *)&local_90);
  std::vector<double_*,_std::allocator<double_*>_>::vector(&local_c8,1,(allocator_type *)&local_90);
  if (local_c8.super__Vector_base<double_*,_std::allocator<double_*>_>._M_impl.
      super__Vector_impl_data._M_start !=
      local_c8.super__Vector_base<double_*,_std::allocator<double_*>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    *local_c8.super__Vector_base<double_*,_std::allocator<double_*>_>._M_impl.
     super__Vector_impl_data._M_start = __return_storage_ptr__->m_data;
  }
  local_118 = uVar6;
  local_b0 = uVar10;
  MFIter::MFIter(&local_90,&local_110->super_FabArrayBase,true);
  if (local_90.currentIndex < local_90.endIndex) {
    uVar10 = (ulong)(uint)ncomp;
    local_128 = (long)icomp << 3;
    local_120 = uVar10;
    local_114 = direction;
    do {
      iVar5 = local_114;
      MFIter::tilebox(&local_14c,&local_90);
      FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>(&local_108,local_110,&local_90);
      local_158 = *local_c8.super__Vector_base<double_*,_std::allocator<double_*>_>._M_impl.
                   super__Vector_impl_data._M_start;
      if (iVar5 == 1) {
        if (0 < ncomp) {
          local_168 = local_128;
          local_178 = 0;
          do {
            iVar5 = local_14c.smallend.vect[2];
            if (local_14c.smallend.vect[2] <= local_14c.bigend.vect[2]) {
              do {
                if (local_14c.smallend.vect[1] <= local_14c.bigend.vect[1]) {
                  iVar9 = local_14c.smallend.vect[1];
                  do {
                    if (local_14c.smallend.vect[0] <= local_14c.bigend.vect[0]) {
                      dVar12 = local_158[local_178 + (long)(iVar9 * ncomp)];
                      lVar7 = 0;
                      do {
                        dVar12 = dVar12 + *(double *)
                                           ((long)local_108.p +
                                           lVar7 * 8 +
                                           ((long)iVar9 - (long)local_108.begin.y) *
                                           local_108.jstride * 8 +
                                           local_108.nstride * local_168 +
                                           ((long)iVar5 - (long)local_108.begin.z) *
                                           local_108.kstride * 8 + (long)local_108.begin.x * -8 +
                                           (long)local_14c.smallend.vect[0] * 8);
                        local_158[local_178 + (long)(iVar9 * ncomp)] = dVar12;
                        lVar7 = lVar7 + 1;
                      } while ((local_14c.bigend.vect[0] - local_14c.smallend.vect[0]) + 1 !=
                               (int)lVar7);
                    }
                    bVar11 = iVar9 != local_14c.bigend.vect[1];
                    iVar9 = iVar9 + 1;
                  } while (bVar11);
                }
                bVar11 = iVar5 != local_14c.bigend.vect[2];
                iVar5 = iVar5 + 1;
              } while (bVar11);
            }
            local_178 = local_178 + 1;
            local_168 = local_168 + 8;
          } while (local_178 != local_120);
        }
      }
      else if (iVar5 == 0) {
        if (0 < ncomp) {
          local_158 = (double *)((long)local_158 + uVar10 * 8 * (long)local_14c.smallend.vect[0]);
          local_170 = local_128;
          uVar4 = 0;
          do {
            iVar5 = local_14c.smallend.vect[2];
            if (local_14c.smallend.vect[2] <= local_14c.bigend.vect[2]) {
              do {
                if (local_14c.smallend.vect[1] <= local_14c.bigend.vect[1]) {
                  iVar9 = local_14c.smallend.vect[1];
                  do {
                    if (local_14c.smallend.vect[0] <= local_14c.bigend.vect[0]) {
                      lVar7 = 0;
                      pdVar3 = local_158;
                      do {
                        *pdVar3 = *(double *)
                                   ((long)local_108.p +
                                   lVar7 * 8 +
                                   ((long)iVar9 - (long)local_108.begin.y) * local_108.jstride * 8 +
                                   local_108.nstride * local_170 +
                                   ((long)iVar5 - (long)local_108.begin.z) * local_108.kstride * 8 +
                                   (long)local_108.begin.x * -8 +
                                   (long)local_14c.smallend.vect[0] * 8) + *pdVar3;
                        lVar7 = lVar7 + 1;
                        pdVar3 = pdVar3 + uVar10;
                      } while ((local_14c.bigend.vect[0] - local_14c.smallend.vect[0]) + 1 !=
                               (int)lVar7);
                    }
                    bVar11 = iVar9 != local_14c.bigend.vect[1];
                    iVar9 = iVar9 + 1;
                  } while (bVar11);
                }
                bVar11 = iVar5 != local_14c.bigend.vect[2];
                iVar5 = iVar5 + 1;
              } while (bVar11);
            }
            uVar4 = uVar4 + 1;
            local_158 = local_158 + 1;
            local_170 = local_170 + 8;
          } while (uVar4 != local_120);
        }
      }
      else if (0 < ncomp) {
        local_168 = local_128;
        local_178 = 0;
        do {
          iVar5 = local_14c.smallend.vect[2];
          if (local_14c.smallend.vect[2] <= local_14c.bigend.vect[2]) {
            do {
              if (local_14c.smallend.vect[1] <= local_14c.bigend.vect[1]) {
                iVar9 = local_14c.smallend.vect[1];
                do {
                  if (local_14c.smallend.vect[0] <= local_14c.bigend.vect[0]) {
                    dVar12 = local_158[local_178 + (long)(iVar5 * ncomp)];
                    lVar7 = 0;
                    do {
                      dVar12 = dVar12 + *(double *)
                                         ((long)local_108.p +
                                         lVar7 * 8 +
                                         ((long)iVar9 - (long)local_108.begin.y) *
                                         local_108.jstride * 8 +
                                         local_108.nstride * local_168 +
                                         ((long)iVar5 - (long)local_108.begin.z) * local_108.kstride
                                         * 8 + (long)local_108.begin.x * -8 +
                                         (long)local_14c.smallend.vect[0] * 8);
                      local_158[local_178 + (long)(iVar5 * ncomp)] = dVar12;
                      lVar7 = lVar7 + 1;
                    } while ((local_14c.bigend.vect[0] - local_14c.smallend.vect[0]) + 1 !=
                             (int)lVar7);
                  }
                  bVar11 = iVar9 != local_14c.bigend.vect[1];
                  iVar9 = iVar9 + 1;
                } while (bVar11);
              }
              bVar11 = iVar5 != local_14c.bigend.vect[2];
              iVar5 = iVar5 + 1;
            } while (bVar11);
          }
          local_178 = local_178 + 1;
          local_168 = local_168 + 8;
        } while (local_178 != local_120);
      }
      MFIter::operator++(&local_90);
    } while (local_90.currentIndex < local_90.endIndex);
  }
  MFIter::~MFIter(&local_90);
  pHVar2 = local_130;
  if ((local_a8.
       super__Vector_base<amrex::PODVector<double,_std::allocator<double>_>,_std::allocator<amrex::PODVector<double,_std::allocator<double>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start !=
       local_a8.
       super__Vector_base<amrex::PODVector<double,_std::allocator<double>_>,_std::allocator<amrex::PODVector<double,_std::allocator<double>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish) && (0 < (int)local_118)) {
    pdVar1 = local_130->m_data;
    uVar10 = 0;
    do {
      dVar12 = pdVar1[uVar10];
      pPVar8 = local_a8.
               super__Vector_base<amrex::PODVector<double,_std::allocator<double>_>,_std::allocator<amrex::PODVector<double,_std::allocator<double>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      do {
        dVar12 = dVar12 + pPVar8->m_data[uVar10];
        pdVar1[uVar10] = dVar12;
        pPVar8 = pPVar8 + 1;
      } while (pPVar8 != local_a8.
                         super__Vector_base<amrex::PODVector<double,_std::allocator<double>_>,_std::allocator<amrex::PODVector<double,_std::allocator<double>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish);
      uVar10 = uVar10 + 1;
    } while (uVar10 != local_b0);
  }
  if (local_c8.super__Vector_base<double_*,_std::allocator<double_*>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_c8.super__Vector_base<double_*,_std::allocator<double_*>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_c8.super__Vector_base<double_*,_std::allocator<double_*>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_c8.super__Vector_base<double_*,_std::allocator<double_*>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  std::
  vector<amrex::PODVector<double,_std::allocator<double>_>,_std::allocator<amrex::PODVector<double,_std::allocator<double>_>_>_>
  ::~vector(&local_a8);
  return pHVar2;
}

Assistant:

Gpu::HostVector<Real> sumToLine (MultiFab const& mf, int icomp, int ncomp,
                                     Box const& domain, int direction, bool local)
    {
        int n1d = domain.length(direction) * ncomp;
        Gpu::HostVector<Real> hv(n1d);

#ifdef AMREX_USE_GPU
        if (Gpu::inLaunchRegion())
        {
            Gpu::DeviceVector<Real> dv(domain.length(direction), Real(0.0));
            Real* p = dv.data();

            for (MFIter mfi(mf); mfi.isValid(); ++mfi) {
                Box const& b = mfi.validbox();
                const auto lo = amrex::lbound(b);
                const auto len = amrex::length(b);
                auto const& fab = mf.const_array(mfi);

                int n2d, n2dx;
                if (direction == 0) {
                    n2d = len.y * len.z;
                    n2dx = len.y;
                } else if (direction == 1) {
                    n2d = len.x * len.z;
                    n2dx = len.x;
                } else {
                    n2d = len.x * len.y;
                    n2dx = len.x;
                }
                int n2dblocks = (n2d+AMREX_GPU_MAX_THREADS-1)/AMREX_GPU_MAX_THREADS;
                int nblocks = n2dblocks * b.length(direction);
#ifdef AMREX_USE_DPCPP
                std::size_t shared_mem_byte = sizeof(Real)*Gpu::Device::warp_size;
                amrex::launch(nblocks, AMREX_GPU_MAX_THREADS, shared_mem_byte, Gpu::gpuStream(),
                              [=] AMREX_GPU_DEVICE (Gpu::Handler const& h) noexcept
#else
                amrex::launch(nblocks, AMREX_GPU_MAX_THREADS, Gpu::gpuStream(),
                              [=] AMREX_GPU_DEVICE () noexcept
#endif
                {
#ifdef AMREX_USE_DPCPP
                    int i1d = h.blockIdx() / n2dblocks;
                    int i2d = h.threadIdx() + h.blockDim()*(h.blockIdx()-i1d*n2dblocks);
#else
                    int i1d = blockIdx.x / n2dblocks;
                    int i2d = threadIdx.x + blockDim.x*(blockIdx.x-i1d*n2dblocks);
#endif
                    int i2dy = i2d / n2dx;
                    int i2dx = i2d - i2dy*n2dx;
                    int i, j, k, idir;
                    if (direction == 0) {
                        i = i1d  + lo.x;
                        j = i2dx + lo.y;
                        k = i2dy + lo.z;
                        idir = i;
                    } else if (direction == 1) {
                        i = i2dx + lo.x;
                        j = i1d  + lo.y;
                        k = i2dy + lo.z;
                        idir = j;
                    } else {
                        i = i2dx + lo.x;
                        j = i2dy + lo.y;
                        k = i1d  + lo.z;
                        idir = k;
                    }
                    for (int n = 0; n < ncomp; ++n) {
                        Real r = (i2d < n2d) ? fab(i,j,k,n+icomp) : Real(0.0);
#ifdef AMREX_USE_DPCPP
                        Gpu::deviceReduceSum_full(p+n+ncomp*idir, r, h);
#else
                        Gpu::deviceReduceSum_full(p+n+ncomp*idir, r);
#endif
                    }
                });
            }

            Gpu::copyAsync(Gpu::deviceToHost, dv.begin(), dv.end(), hv.begin());
            Gpu::streamSynchronize();
        }
        else
#endif
        {
            for (auto& x : hv) {
                x = Real(0.0);
            }

            Vector<Gpu::HostVector<Real> > other_hv(OpenMP::get_max_threads()-1);

            Vector<Real*> pp(OpenMP::get_max_threads());
            if (!pp.empty()) {
                pp[0] = hv.data();
            }
            for (int i = 1; i < OpenMP::get_max_threads(); ++i) {
                other_hv[i-1].resize(n1d, Real(0.0));
                pp[i] = other_hv[i-1].data();
            }

#ifdef AMREX_USE_OMP
#pragma omp parallel
#endif
            for (MFIter mfi(mf,true); mfi.isValid(); ++mfi) {
                Box const& b = mfi.tilebox();
                auto const& fab = mf.const_array(mfi);
                Real * AMREX_RESTRICT p = pp[OpenMP::get_thread_num()];
                if (direction == 0) {
                    amrex::LoopOnCpu(b, ncomp, [&] (int i, int j, int k, int n) noexcept
                    {
                        p[n+ncomp*i] += fab(i,j,k,n+icomp);
                    });
                } else if (direction == 1) {
                    amrex::LoopOnCpu(b, ncomp, [&] (int i, int j, int k, int n) noexcept
                    {
                        p[n+ncomp*j] += fab(i,j,k,n+icomp);
                    });
                } else {
                    amrex::LoopOnCpu(b, ncomp, [&] (int i, int j, int k, int n) noexcept
                    {
                        p[n+ncomp*k] += fab(i,j,k,n+icomp);
                    });
                }
            }

            if (! other_hv.empty()) {
#ifdef AMREX_USE_OMP
#pragma omp parallel for
#endif
                for (int i = 0; i < n1d; ++i) {
                    for (auto const& v : other_hv) {
                        hv[i] += v[i];
                    }
                }
            }
        }

        if (!local) {
            ParallelAllReduce::Sum(hv.data(), hv.size(), ParallelContext::CommunicatorSub());
        }
        return hv;
    }